

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Arg.h
# Opt level: O3

void TCLAP::ExtractValue<double>(double *destVal,string *strVal,ValueLike *vl)

{
  int iVar1;
  long lVar2;
  ArgParseException *pAVar3;
  long *plVar4;
  size_type *psVar5;
  uint uVar6;
  istringstream is;
  string local_208;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e8;
  string local_1c8;
  double local_1a8 [4];
  byte abStack_188 [88];
  ios_base local_130 [264];
  
  std::__cxx11::istringstream::istringstream((istringstream *)local_1a8,(string *)strVal,_S_in);
  if (*(int *)(abStack_188 + *(long *)((long)local_1a8[0] + -0x18)) == 0) {
    uVar6 = 0;
    do {
      iVar1 = std::istream::peek();
      if (iVar1 == -1) {
        lVar2 = *(long *)((long)local_1a8[0] + -0x18);
        break;
      }
      std::istream::_M_extract<double>(local_1a8);
      uVar6 = uVar6 + 1;
      lVar2 = *(long *)((long)local_1a8[0] + -0x18);
    } while (*(int *)(abStack_188 + lVar2) == 0);
    if ((abStack_188[lVar2] & 5) == 0) {
      if (1 < uVar6) {
        pAVar3 = (ArgParseException *)__cxa_allocate_exception(0x68);
        std::operator+(&local_1e8,"More than one valid value parsed from string \'",strVal);
        plVar4 = (long *)std::__cxx11::string::append((char *)&local_1e8);
        local_208._M_dataplus._M_p = (pointer)*plVar4;
        psVar5 = (size_type *)(plVar4 + 2);
        if ((size_type *)local_208._M_dataplus._M_p == psVar5) {
          local_208.field_2._M_allocated_capacity = *psVar5;
          local_208.field_2._8_4_ = (undefined4)plVar4[3];
          local_208.field_2._12_4_ = *(undefined4 *)((long)plVar4 + 0x1c);
          local_208._M_dataplus._M_p = (pointer)&local_208.field_2;
        }
        else {
          local_208.field_2._M_allocated_capacity = *psVar5;
        }
        local_208._M_string_length = plVar4[1];
        *plVar4 = (long)psVar5;
        plVar4[1] = 0;
        *(undefined1 *)(plVar4 + 2) = 0;
        local_1c8._M_dataplus._M_p = (pointer)&local_1c8.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_1c8,"undefined","");
        ArgParseException::ArgParseException(pAVar3,&local_208,&local_1c8);
        __cxa_throw(pAVar3,&ArgParseException::typeinfo,ArgException::~ArgException);
      }
      goto LAB_00128aad;
    }
  }
  else if ((abStack_188[*(long *)((long)local_1a8[0] + -0x18)] & 5) == 0) {
LAB_00128aad:
    std::__cxx11::istringstream::~istringstream((istringstream *)local_1a8);
    std::ios_base::~ios_base(local_130);
    return;
  }
  pAVar3 = (ArgParseException *)__cxa_allocate_exception(0x68);
  std::operator+(&local_1e8,"Couldn\'t read argument value from string \'",strVal);
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_1e8);
  local_208._M_dataplus._M_p = (pointer)*plVar4;
  psVar5 = (size_type *)(plVar4 + 2);
  if ((size_type *)local_208._M_dataplus._M_p == psVar5) {
    local_208.field_2._M_allocated_capacity = *psVar5;
    local_208.field_2._8_4_ = (undefined4)plVar4[3];
    local_208.field_2._12_4_ = *(undefined4 *)((long)plVar4 + 0x1c);
    local_208._M_dataplus._M_p = (pointer)&local_208.field_2;
  }
  else {
    local_208.field_2._M_allocated_capacity = *psVar5;
  }
  local_208._M_string_length = plVar4[1];
  *plVar4 = (long)psVar5;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  local_1c8._M_dataplus._M_p = (pointer)&local_1c8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1c8,"undefined","");
  ArgParseException::ArgParseException(pAVar3,&local_208,&local_1c8);
  __cxa_throw(pAVar3,&ArgParseException::typeinfo,ArgException::~ArgException);
}

Assistant:

void
ExtractValue(T &destVal, const std::string& strVal, ValueLike vl)
{
    static_cast<void>(vl); // Avoid warning about unused vl
    std::istringstream is(strVal);

    int valuesRead = 0;
    while ( is.good() ) {
	if ( is.peek() != EOF )
#ifdef TCLAP_SETBASE_ZERO
	    is >> std::setbase(0) >> destVal;
#else
	    is >> destVal;
#endif
	else
	    break;

	valuesRead++;
    }

    if ( is.fail() )
	throw( ArgParseException("Couldn't read argument value "
				 "from string '" + strVal + "'"));


    if ( valuesRead > 1 )
	throw( ArgParseException("More than one valid value parsed from "
				 "string '" + strVal + "'"));

}